

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::CheckPlanes(FFlatVertexBuffer *this,sector_t *sector)

{
  double dVar1;
  sector_t *sector_local;
  FFlatVertexBuffer *this_local;
  
  dVar1 = sector_t::GetPlaneTexZ(sector,1);
  if ((dVar1 != sector->vboheight[1]) || (NAN(dVar1) || NAN(sector->vboheight[1]))) {
    UpdatePlaneVertices(this,sector,1);
    dVar1 = sector_t::GetPlaneTexZ(sector,1);
    sector->vboheight[1] = dVar1;
  }
  dVar1 = sector_t::GetPlaneTexZ(sector,0);
  if ((dVar1 != sector->vboheight[0]) || (NAN(dVar1) || NAN(sector->vboheight[0]))) {
    UpdatePlaneVertices(this,sector,0);
    dVar1 = sector_t::GetPlaneTexZ(sector,0);
    sector->vboheight[0] = dVar1;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CheckPlanes(sector_t *sector)
{
	if (sector->GetPlaneTexZ(sector_t::ceiling) != sector->vboheight[sector_t::ceiling])
	{
		UpdatePlaneVertices(sector, sector_t::ceiling);
		sector->vboheight[sector_t::ceiling] = sector->GetPlaneTexZ(sector_t::ceiling);
	}
	if (sector->GetPlaneTexZ(sector_t::floor) != sector->vboheight[sector_t::floor])
	{
		UpdatePlaneVertices(sector, sector_t::floor);
		sector->vboheight[sector_t::floor] = sector->GetPlaneTexZ(sector_t::floor);
	}
}